

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FragmentOutputCase::FragmentOutputCase
          (FragmentOutputCase *this,Context *context,char *name,char *desc,
          vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
          *fboSpec,vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                   *outputs)

{
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  *outputs_local;
  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
  *fboSpec_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  FragmentOutputCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FragmentOutputCase_015ade38;
  std::
  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
  ::vector(&this->m_fboSpec,fboSpec);
  std::
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  ::vector(&this->m_outputs,outputs);
  this->m_program = (ShaderProgram *)0x0;
  this->m_framebuffer = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_renderbuffers);
  return;
}

Assistant:

FragmentOutputCase::FragmentOutputCase (Context& context, const char* name, const char* desc, const vector<BufferSpec>& fboSpec, const vector<FragmentOutput>& outputs)
	: TestCase		(context, name, desc)
	, m_fboSpec		(fboSpec)
	, m_outputs		(outputs)
	, m_program		(DE_NULL)
	, m_framebuffer	(0)
{
}